

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# settings_pack.cpp
# Opt level: O2

void libtorrent::initialize_default_settings(session_settings_single_thread *s)

{
  string *psVar1;
  undefined *puVar2;
  int i;
  long lVar3;
  string local_40;
  
  psVar1 = (string *)&DAT_004d8910;
  for (lVar3 = 0; lVar3 != 0xd; lVar3 = lVar3 + 1) {
    if (*(long *)(psVar1 + 8) != 0) {
      ::std::__cxx11::string::string((string *)&local_40,psVar1);
      aux::session_settings_single_thread::set_str(s,(int)lVar3,&local_40);
      ::std::__cxx11::string::~string((string *)&local_40);
    }
    psVar1 = psVar1 + 0x38;
  }
  for (lVar3 = 0; lVar3 != 0x27c; lVar3 = lVar3 + 4) {
    *(undefined4 *)((long)(s->m_ints)._M_elems + lVar3) = *(undefined4 *)(&DAT_004ce218 + lVar3 * 8)
    ;
  }
  puVar2 = &DAT_004cf5f8;
  for (lVar3 = 0; lVar3 != 0x54; lVar3 = lVar3 + 1) {
    aux::session_settings_single_thread::set_bool(s,(uint)lVar3 | 0x8000,(bool)*puVar2);
    puVar2 = puVar2 + 0x20;
  }
  return;
}

Assistant:

void initialize_default_settings(aux::session_settings_single_thread& s)
	{
		for (int i = 0; i < settings_pack::num_string_settings; ++i)
		{
			if (str_settings[i].default_value.empty()) continue;
			s.set_str(settings_pack::string_type_base | i, str_settings[i].default_value);
			TORRENT_ASSERT(s.get_str(settings_pack::string_type_base + i) == str_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_int_settings; ++i)
		{
			s.set_int(settings_pack::int_type_base | i, int_settings[i].default_value);
			TORRENT_ASSERT(s.get_int(settings_pack::int_type_base + i) == int_settings[i].default_value);
		}

		for (int i = 0; i < settings_pack::num_bool_settings; ++i)
		{
			s.set_bool(settings_pack::bool_type_base | i, bool_settings[i].default_value);
			TORRENT_ASSERT(s.get_bool(settings_pack::bool_type_base + i) == bool_settings[i].default_value);
		}
	}